

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_callback_finalize_many_
              (event_base *base,int n_cbs,event_callback **evcbs,
              _func_void_event_callback_ptr_void_ptr *cb)

{
  event_callback *evcb_00;
  event_callback *evcb;
  int i;
  int n_pending;
  _func_void_event_callback_ptr_void_ptr *cb_local;
  event_callback **evcbs_local;
  event_base *peStack_10;
  int n_cbs_local;
  event_base *base_local;
  
  evcb._4_4_ = 0;
  peStack_10 = base;
  if (base == (event_base *)0x0) {
    peStack_10 = event_global_current_base_;
  }
  if (peStack_10->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,peStack_10->th_base_lock);
  }
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("%s: %d events finalizing","event_callback_finalize_many_",(ulong)(uint)n_cbs);
  }
  for (evcb._0_4_ = 0; (int)evcb < n_cbs; evcb._0_4_ = (int)evcb + 1) {
    evcb_00 = evcbs[(int)evcb];
    if (evcb_00 == peStack_10->current_event) {
      event_callback_finalize_nolock_(peStack_10,0,evcb_00,cb);
      evcb._4_4_ = evcb._4_4_ + 1;
    }
    else {
      event_callback_cancel_nolock_(peStack_10,evcb_00,0);
    }
  }
  if (evcb._4_4_ == 0) {
    event_callback_finalize_nolock_(peStack_10,0,*evcbs,cb);
  }
  if (peStack_10->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,peStack_10->th_base_lock);
  }
  return 0;
}

Assistant:

int
event_callback_finalize_many_(struct event_base *base, int n_cbs, struct event_callback **evcbs, void (*cb)(struct event_callback *, void *))
{
	int n_pending = 0, i;

	if (base == NULL)
		base = current_base;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	event_debug(("%s: %d events finalizing", __func__, n_cbs));

	/* At most one can be currently executing; the rest we just
	 * cancel... But we always make sure that the finalize callback
	 * runs. */
	for (i = 0; i < n_cbs; ++i) {
		struct event_callback *evcb = evcbs[i];
		if (evcb == base->current_event) {
			event_callback_finalize_nolock_(base, 0, evcb, cb);
			++n_pending;
		} else {
			event_callback_cancel_nolock_(base, evcb, 0);
		}
	}

	if (n_pending == 0) {
		/* Just do the first one. */
		event_callback_finalize_nolock_(base, 0, evcbs[0], cb);
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return 0;
}